

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_compaction_test.cc
# Opt level: O2

void multi_writers(char *test_name)

{
  timeval b;
  fdb_status fVar1;
  ulong uVar2;
  int i;
  uint uVar3;
  char *__format;
  long lVar4;
  long lVar5;
  timeval tVar6;
  fdb_file_handle *dbfile;
  pthread_t local_1518 [2];
  char *local_1508;
  timeval ts_begin;
  timeval ts_cur;
  undefined8 local_14e0;
  void *local_14d8 [2];
  timeval __test_begin;
  pthread_t apStack_14b8 [8];
  void *apvStack_1478 [9];
  fdb_config local_1430;
  undefined4 local_1338 [2];
  undefined1 local_1330 [248];
  long alStack_1238 [3];
  undefined1 auStack_1220 [248];
  undefined4 auStack_1128 [4];
  undefined8 uStack_1118;
  char acStack_1110 [256];
  char acStack_1010 [16];
  undefined1 auStack_1000 [4048];
  
  local_1508 = test_name;
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf ./big_file* > errorlog.txt");
  printf("\nLoading %lu docs %d key length %d bodylen. Buffercache %luMB. Target docsize %luMB...",
         0x964fda,200,10,0x14,0x800);
  gettimeofday((timeval *)&ts_begin,(__timezone_ptr_t)0x0);
  fdb_get_default_config();
  local_1430.multi_kv_instances = true;
  local_1430.buffercache_size = 0x1400000;
  local_1430.durability_opt = '\x01';
  fVar1 = fdb_open(&dbfile,"./big_file",&local_1430);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
            ,0xdf);
    multi_writers(char_const*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                  ,0xdf,"void multi_writers(const char *)");
  }
  lVar4 = 0x964fd7;
  for (uVar3 = 7; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    uVar2 = (ulong)uVar3;
    lVar5 = uVar2 * 0x240;
    alStack_1238[uVar2 * 0x48 + 1] = uVar2 * 0x12c9fb;
    alStack_1238[uVar2 * 0x48] = lVar4;
    memcpy(auStack_1220 + lVar5,&local_1430,0xf8);
    fdb_get_default_kvs_config();
    (&uStack_1118)[uVar2 * 0x48] = local_14e0;
    auStack_1128[uVar2 * 0x90] = (undefined4)ts_cur.tv_sec;
    auStack_1128[uVar2 * 0x90 + 1] = ts_cur.tv_sec._4_4_;
    auStack_1128[uVar2 * 0x90 + 2] = (undefined4)ts_cur.tv_usec;
    auStack_1128[uVar2 * 0x90 + 3] = ts_cur.tv_usec._4_4_;
    *(undefined8 *)(auStack_1220 + lVar5 + -8) = 0x267a;
    auStack_1000[lVar5] = 1;
    sprintf(acStack_1110 + lVar5,"%s_%d.0","./big_file",(ulong)uVar3);
    sprintf(acStack_1010 + lVar5,"kv_%d",0);
    pthread_create(apStack_14b8 + uVar2,(pthread_attr_t *)0x0,_writer_thread,
                   alStack_1238 + uVar2 * 0x48);
    lVar4 = lVar4 + -0x12c9fb;
  }
  local_1338[0] = 8;
  memcpy(local_1330,&local_1430,0xf8);
  pthread_create(local_1518,(pthread_attr_t *)0x0,_compactor_thread,local_1338);
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 8) {
    pthread_join(*(pthread_t *)((long)apStack_14b8 + lVar4),(void **)((long)apvStack_1478 + lVar4));
  }
  local_1338[0] = 0;
  pthread_join(local_1518[0],local_14d8);
  fVar1 = fdb_commit(dbfile,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
            ,0xfb);
    multi_writers(char_const*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                  ,0xfb,"void multi_writers(const char *)");
  }
  gettimeofday((timeval *)&ts_cur,(__timezone_ptr_t)0x0);
  tVar6.tv_sec._4_4_ = ts_cur.tv_sec._4_4_;
  tVar6.tv_sec._0_4_ = (undefined4)ts_cur.tv_sec;
  tVar6.tv_usec._0_4_ = (undefined4)ts_cur.tv_usec;
  tVar6.tv_usec._4_4_ = ts_cur.tv_usec._4_4_;
  tVar6 = _utime_gap(ts_begin,tVar6);
  printf("\nFile created %lu docs loaded (keylen %d doclen %d) in%ldsec",0x964fda,200,10,
         tVar6.tv_sec);
  printf("\nStarting compaction...");
  putchar(10);
  gettimeofday((timeval *)&ts_begin,(__timezone_ptr_t)0x0);
  fVar1 = fdb_compact_with_cow(dbfile,"./big_file2");
  if (fVar1 == FDB_RESULT_COMPACTION_FAIL) {
    fVar1 = fdb_compact(dbfile,"./big_file2");
  }
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
            ,0x10b);
    multi_writers(char_const*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                  ,0x10b,"void multi_writers(const char *)");
  }
  gettimeofday((timeval *)&ts_cur,(__timezone_ptr_t)0x0);
  b.tv_sec._4_4_ = ts_cur.tv_sec._4_4_;
  b.tv_sec._0_4_ = (undefined4)ts_cur.tv_sec;
  b.tv_usec._0_4_ = (undefined4)ts_cur.tv_usec;
  b.tv_usec._4_4_ = ts_cur.tv_usec._4_4_;
  tVar6 = _utime_gap(ts_begin,b);
  printf("\nCompaction completed in %ld seconds\n",tVar6.tv_sec,tVar6.tv_usec);
  fVar1 = fdb_close(dbfile);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
            ,0x113);
    multi_writers(char_const*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                  ,0x113,"void multi_writers(const char *)");
  }
  fVar1 = fdb_shutdown();
  if (fVar1 == FDB_RESULT_SUCCESS) {
    memleak_end();
    __format = "%s PASSED\n";
    if (multi_writers(char_const*)::__test_pass != '\0') {
      __format = "%s FAILED\n";
    }
    fprintf(_stderr,__format,local_1508);
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
          ,0x117);
  multi_writers(char_const*)::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                ,0x117,"void multi_writers(const char *)");
}

Assistant:

void multi_writers(const char *test_name) {
    TEST_INIT();
    memleak_start();

    int num_writers = NUM_WRITERS;
    int64_t writer_shard_size = NUM_DOCS / NUM_WRITERS;
    fdb_file_handle *dbfile;
    fdb_config fconfig;
    int r;
    fdb_status status;
    struct writer_thread_args *wargs = alca(struct writer_thread_args,
                                       num_writers);
    thread_t *tid = alca(thread_t, num_writers);
    thread_t *compactor_tid = alca(thread_t, 1);
    void **compactor_ret = alca(void *, 1);
    struct compactor_thread_args *cargs = alca(struct compactor_thread_args, 1);
    void **thread_ret = alca(void *, num_writers);
    struct timeval ts_begin, ts_cur, ts_gap;

    // remove previous test files
    r = system(SHELL_DEL TEST_FILENAME "* > errorlog.txt");
    (void) r;

    printf("\nLoading %" _F64 " docs %d key length %d bodylen."
           " Buffercache %" _F64 "MB. Target docsize %" _F64 "MB...",
            NUM_DOCS, MAX_KEY_LEN, BODY_LEN,
            BUFFERCACHE_SIZE ? (uint64_t)BUFFERCACHE_SIZE/ (1024 * 1024) : 0,
            (uint64_t)(MAX_KEY_LEN + BODY_LEN + 8) * NUM_DOCS / (1024 * 1024));
    gettimeofday(&ts_begin, NULL);

    fconfig = fdb_get_default_config();
    fconfig.multi_kv_instances = MULTI_KV;
    fconfig.buffercache_size = BUFFERCACHE_SIZE;
    fconfig.durability_opt = FDB_DRB_ODIRECT;
    status = fdb_open(&dbfile, TEST_FILENAME, &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (int i = num_writers - 1; i >= 0; --i) {
        // Writer Thread Config:
        wargs[i].docid_low = i*writer_shard_size;
        wargs[i].docid_high = ((i + 1) * writer_shard_size) - 1;
        wargs[i].config = fconfig;
        wargs[i].kvs_config = fdb_get_default_kvs_config();
        wargs[i].batch_size = NUM_DOCS / 1000;
        wargs[i].commit_opt = FDB_COMMIT_MANUAL_WAL_FLUSH;
        sprintf(wargs[i].test_file_name, "%s_%d.0", TEST_FILENAME, i);
        sprintf(wargs[i].kv_store_name, "kv_%d", 0);

        thread_create(&tid[i], _writer_thread, &wargs[i]);
    }

    cargs->num_files = num_writers;
    cargs->config = fconfig;
    thread_create(compactor_tid, _compactor_thread, cargs);

    // wait for thread termination
    for (int i = 0; i < num_writers; ++i) {
        thread_join(tid[i], &thread_ret[i]);
    }
    cargs->num_files = 0; // ask compactor to stop
    thread_join(*compactor_tid, compactor_ret);

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    gettimeofday(&ts_cur, NULL);
    ts_gap = _utime_gap(ts_begin, ts_cur);

    printf("\nFile created %" _F64 " docs loaded (keylen %d doclen %d) in"
           "%ldsec", NUM_DOCS, MAX_KEY_LEN, BODY_LEN, ts_gap.tv_sec);

    printf("\nStarting compaction...");
    printf("\n"); // flush stdio buffer
    gettimeofday(&ts_begin, NULL);

    status = fdb_compact_with_cow(dbfile, TEST_FILENAME "2");
    if (status == FDB_RESULT_COMPACTION_FAIL) {
        status = fdb_compact(dbfile, TEST_FILENAME "2");
    }
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    gettimeofday(&ts_cur, NULL);
    ts_gap = _utime_gap(ts_begin, ts_cur);

    printf("\nCompaction completed in %ld seconds\n", ts_gap.tv_sec);

    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // shutdown
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    memleak_end();
    TEST_RESULT(test_name);
}